

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polymer.cpp
# Opt level: O0

bool __thiscall Polymer::CheckReadthroughPolCollisions(Polymer *this,Ptr *pol)

{
  int iVar1;
  int iVar2;
  element_type *peVar3;
  undefined1 local_30 [8];
  Ptr next_pol;
  Ptr *pol_local;
  Polymer *this_local;
  
  next_pol.super___shared_ptr<MobileElement,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pol;
  MobileElementManager::GetPol((MobileElementManager *)local_30,(int)this + 0x90);
  peVar3 = std::__shared_ptr_access<MobileElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<MobileElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)pol);
  iVar1 = MobileElement::stop(peVar3);
  if (this->stop_ <= iVar1) {
    peVar3 = std::__shared_ptr_access<MobileElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<MobileElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_30);
    iVar1 = MobileElement::start(peVar3);
    peVar3 = std::__shared_ptr_access<MobileElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<MobileElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)pol);
    iVar2 = MobileElement::footprint(peVar3);
    if (iVar1 <= iVar2) {
      this_local._7_1_ = true;
      goto LAB_0011ff6a;
    }
  }
  this_local._7_1_ = false;
LAB_0011ff6a:
  std::shared_ptr<MobileElement>::~shared_ptr((shared_ptr<MobileElement> *)local_30);
  return this_local._7_1_;
}

Assistant:

bool Polymer::CheckReadthroughPolCollisions(MobileElement::Ptr pol) {
  auto next_pol = polymerases_.GetPol(0);
  if (pol->stop() >= stop_) {
    if (next_pol->start() <= pol->footprint()) {
      return true;
    }
  } 
  return false;
}